

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions_reductions.hpp
# Opt level: O0

size_type __thiscall
std::experimental::detail::
dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,0ul,1ul>
::operator()(dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,0ul,1ul>
             *this,dynamic_dims_array d0,_Type d1)

{
  value_type d;
  value_type s;
  value_type p;
  unsigned_long uVar1;
  size_type v1;
  dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,1ul>
  local_2b;
  span_by_value local_2a;
  multiplies_by_value local_29;
  dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,0ul,1ul>
  *local_28;
  dims_ternary_reduction<std::experimental::detail::span_by_value,_std::experimental::detail::multiplies_by_value,_std::experimental::detail::static_sentinel<1UL>,_0UL,_1UL>
  *this_local;
  dynamic_dims_array local_18;
  dimensions<18446744073709551615UL> d1_local;
  dimensions<18446744073709551615UL> d0_local;
  
  local_28 = this;
  local_18._M_elems[0] = (_Type)(_Type)d1[0];
  d1_local.dynamic_dims_._M_elems[0] = (dynamic_dims_array)(dynamic_dims_array)d0._M_elems[0];
  d = dimensions<18446744073709551615UL>::operator[]<unsigned_long>(&d1_local,0);
  s = dimensions<18446744073709551615UL>::operator[]<unsigned_long>
                ((dimensions<18446744073709551615UL> *)&local_18,0);
  p = dimensions<0UL>::operator[]<unsigned_long>((dimensions<0UL> *)((long)&this_local + 7),0);
  uVar1 = span_by_value::operator()(&local_2a,d,s,p);
  v1 = dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,1ul>
       ::operator()(&local_2b,d1_local.dynamic_dims_._M_elems[0],local_18._M_elems[0]);
  uVar1 = multiplies_by_value::operator()(&local_29,uVar1,v1);
  return uVar1;
}

Assistant:

constexpr typename dimensions<Dims0...>::size_type operator()(
        dimensions<Dims0...> d0
      , dimensions<Dims1...> d1
      , dimensions<Dims2...> d2
        ) const noexcept
    {
        static_assert(
               dimensions<Dims0...>::rank() == dimensions<Dims1...>::rank()
            && dimensions<Dims0...>::rank() == dimensions<Dims2...>::rank()
          , "Arguments to ternary reduction have unequal rank"
        );
        static_assert(
               dimensions<Dims0...>::rank() == Size 
            || dimensions<Dims1...>::rank() == Size 
            || dimensions<Dims2...>::rank() == Size 
          , "Size not equal to rank of arguments"
        );

        return Reduction()(
            Op()(d0[Idx], d1[Idx], d2[Idx])
          , dims_ternary_reduction<Op, Reduction, Sentinel, Idx + 1, Size>()
                (std::move(d0), std::move(d1), std::move(d2))
        );
    }